

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O0

void bifinc(bifcxdef *ctx,int argc)

{
  long lVar1;
  undefined8 uVar2;
  int iVar3;
  int in_ESI;
  long in_RDI;
  voccxdef *unaff_retaddr;
  int turncnt;
  undefined8 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  
  if (in_ESI == 1) {
    lVar1 = *(long *)(*(long *)(in_RDI + 8) + 0x20);
    *(long *)(*(long *)(in_RDI + 8) + 0x20) = lVar1 + -0x10;
    if (*(char *)(lVar1 + -0x10) != '\x01') {
      *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 0;
      runsign((runcxdef *)CONCAT44(1,in_stack_fffffffffffffff0),
              (int)((ulong)in_stack_ffffffffffffffe8 >> 0x20));
    }
    uVar2 = *(undefined8 *)(*(long *)(*(long *)(in_RDI + 8) + 0x20) + 8);
    iVar3 = (int)uVar2;
    if (iVar3 < 1) {
      *(char **)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x18) = "incturn";
      *(undefined4 *)(*(long *)**(undefined8 **)(in_RDI + 8) + 0x68) = 1;
      runsign((runcxdef *)CONCAT44(1,iVar3),(int)((ulong)uVar2 >> 0x20));
    }
  }
  vocturn(unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  return;
}

Assistant:

void bifinc(bifcxdef *ctx, int argc)
{
    int turncnt;
    
    if (argc == 1)
    {
        /* get the number of turns to skip */
        turncnt = runpopnum(ctx->bifcxrun);
        if (turncnt < 1)
            runsig1(ctx->bifcxrun, ERR_INVVBIF, ERRTSTR, "incturn");
    }
    else
    {
        /* no arguments -> increment by one turn */
        bifcntargs(ctx, 0, argc);
        turncnt = 1;
    }

    /* skip the given number of turns */
    vocturn(ctx->bifcxrun->runcxvoc, turncnt, TRUE);
}